

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

unique_ptr<Catch::Detail::EnumInfo>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  size_type *psVar1;
  int *piVar2;
  EnumInfo *pEVar3;
  long *in_R9;
  long lVar4;
  int *piVar5;
  StringRef enums;
  int value;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  int local_4c;
  _Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_48;
  
  pEVar3 = (EnumInfo *)enumName.m_start;
  make_unique<Catch::Detail::EnumInfo>();
  psVar1 = (size_type *)(pEVar3->m_name).m_start;
  *psVar1 = enumName.m_size;
  psVar1[1] = (size_type)allValueNames.m_start;
  std::vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
  ::reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
             *)((pEVar3->m_name).m_start + 0x10),in_R9[1] - *in_R9 >> 2);
  enums.m_size = (size_type)values;
  enums.m_start = (char *)allValueNames.m_size;
  parseEnums((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)&local_48,enums);
  piVar2 = (int *)in_R9[1];
  lVar4 = 0;
  for (piVar5 = (int *)*in_R9; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    local_4c = *piVar5;
    std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
    emplace_back<int&,Catch::StringRef_const&>
              ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                *)((pEVar3->m_name).m_start + 0x10),&local_4c,
               (StringRef *)
               ((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->m_start + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base(&local_48);
  return (unique_ptr<Catch::Detail::EnumInfo>)pEVar3;
}

Assistant:

Catch::Detail::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            auto enumInfo = Catch::Detail::make_unique<EnumInfo>();
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }